

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_utilities.h
# Opt level: O2

point dlib::
      max_point<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
                (matrix_exp<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
                 *m)

{
  float fVar1;
  long lVar2;
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  ulong *in_RDI;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  undefined1 auVar10 [64];
  point pVar11;
  
  lVar4 = **(long **)m;
  lVar2 = (*(long **)m)[3];
  pVar11.
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[1] = lVar2 * 4;
  lVar2 = *(long *)(m + 0x10) * 4 + *(long *)(m + 8) * lVar2 * 4;
  auVar10 = ZEXT464(*(uint *)(lVar4 + lVar2));
  lVar4 = lVar4 + lVar2;
  uVar6 = 0;
  uVar7 = 0;
  for (uVar8 = 0; uVar8 != (~((long)*(ulong *)(m + 0x18) >> 0x3f) & *(ulong *)(m + 0x18));
      uVar8 = uVar8 + 1) {
    for (uVar5 = 0; (~((long)*(ulong *)(m + 0x20) >> 0x3f) & *(ulong *)(m + 0x20)) != uVar5;
        uVar5 = uVar5 + 1) {
      fVar1 = *(float *)(lVar4 + uVar5 * 4);
      fVar9 = auVar10._0_4_;
      auVar3 = vmaxss_avx(ZEXT416((uint)fVar1),auVar10._0_16_);
      auVar10 = ZEXT1664(auVar3);
      if (fVar9 < fVar1) {
        uVar7 = uVar5;
        uVar6 = uVar8;
      }
    }
    lVar4 = lVar4 + pVar11.
                    super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                    .data.data[1];
  }
  *in_RDI = uVar7;
  in_RDI[1] = uVar6;
  pVar11.
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[0] = (long)in_RDI;
  return (point)pVar11.
                super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                .data.data;
}

Assistant:

point max_point (
        const matrix_exp<EXP>& m
    )
    {
        DLIB_ASSERT(m.size() > 0, 
            "\tpoint max_point(const matrix_exp& m)"
            << "\n\tm can't be empty"
            << "\n\tm.size():   " << m.size() 
            << "\n\tm.nr():     " << m.nr() 
            << "\n\tm.nc():     " << m.nc() 
            );
        typedef typename matrix_exp<EXP>::type type;

        point best_point(0,0);
        type val = m(0,0);
        for (long r = 0; r < m.nr(); ++r)
        {
            for (long c = 0; c < m.nc(); ++c)
            {
                type temp = m(r,c);
                if (dlib::impl::magnitude(temp) > dlib::impl::magnitude(val))
                {
                    val = temp;
                    best_point = point(c,r);
                }
            }
        }
        return best_point;
    }